

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

void __thiscall QApplicationPrivate::initialize(QApplicationPrivate *this)

{
  char cVar1;
  int iVar2;
  QStyle *style;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplicationPrivate::is_app_running._0_1_ = 0;
  QWidgetPrivate::mapper = (QWidgetMapper *)operator_new(8);
  QWidgetPrivate::mapper->d = (Data *)0x0;
  QWidgetPrivate::allWidgets = (QWidgetSet *)operator_new(8);
  (QWidgetPrivate::allWidgets->q_hash).d = (Data *)0x0;
  qRegisterWidgetsVariant();
  QAbstractDeclarativeData::setWidgetParent = QWidgetPrivate::setWidgetParentHelper;
  if (this->field_0x90 != '\0') {
    if (_topLevelAt != 0) {
      QString::toLower_helper((QString *)local_58.data);
      style = QStyleFactory::create((QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      if (style == (QStyle *)0x0) {
        local_58._0_4_ = 2;
        local_58._20_4_ = 0;
        local_58._4_8_ = 0;
        local_58._12_8_ = 0;
        local_40 = "default";
        QString::toLocal8Bit
                  ((QByteArray *)&local_70,(QString *)&QGuiApplicationPrivate::styleOverride);
        if (local_70.ptr == (char *)0x0) {
          local_70.ptr = (char *)&QByteArray::_empty;
        }
        QStyleFactory::keys();
        QtPrivate::QStringList_join((QList_conflict *)&local_a0,(QLatin1String *)&QStack_b8);
        QString::toLocal8Bit((QByteArray *)&local_88,(QString *)&local_a0);
        if (local_88.ptr == (char *)0x0) {
          local_88.ptr = (char *)&QByteArray::_empty;
        }
        QMessageLogger::warning
                  ((char *)local_58.data,
                   "QApplication: invalid style override \'%s\' passed, ignoring it.\n\tAvailable styles: %s"
                   ,local_70.ptr,local_88.ptr);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_b8);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
        QString::clear((QString *)&QGuiApplicationPrivate::styleOverride);
      }
      else {
        QApplication::setStyle(style);
      }
    }
    QApplication::style();
  }
  iVar2 = qEnvironmentVariableIntValue("QT_USE_NATIVE_WINDOWS",(bool *)0x0);
  if (0 < iVar2) {
    QCoreApplication::setAttribute(AA_NativeWindows,true);
  }
  cVar1 = QGuiApplication::desktopSettingsAware();
  if ((cVar1 != '\0') && (QGuiApplicationPrivate::platform_theme != (long *)0x0)) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_58,QGuiApplicationPrivate::platform_theme,0x17);
    enabledAnimations = ::QVariant::toInt((bool *)local_58.data);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  QCoreApplicationPrivate::is_app_running._0_1_ = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::initialize()
{
    is_app_running = false; // Starting up.

    QWidgetPrivate::mapper = new QWidgetMapper;
    QWidgetPrivate::allWidgets = new QWidgetSet;

    // needed for a static build.
    qRegisterWidgetsVariant();

    // needed for widgets in QML
    QAbstractDeclarativeData::setWidgetParent = QWidgetPrivate::setWidgetParentHelper;

    if (application_type != QApplicationPrivate::Tty) {
        if (!styleOverride.isEmpty()) {
            if (auto *style = QStyleFactory::create(styleOverride.toLower())) {
                QApplication::setStyle(style);
            } else {
                qWarning("QApplication: invalid style override '%s' passed, ignoring it.\n"
                    "\tAvailable styles: %s", qPrintable(styleOverride),
                    qPrintable(QStyleFactory::keys().join(", "_L1)));
                // Clear styleOverride so it is not picked by Qt Quick Controls (QTBUG-100563)
                styleOverride.clear();
            }
        }

        // Trigger default style if none was set already
        Q_UNUSED(QApplication::style());
    }

    if (qEnvironmentVariableIntValue("QT_USE_NATIVE_WINDOWS") > 0)
        QCoreApplication::setAttribute(Qt::AA_NativeWindows);

    if (!qt_is_tty_app)
        initializeMultitouch();

    if (QGuiApplication::desktopSettingsAware())
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
            QApplicationPrivate::enabledAnimations = theme->themeHint(QPlatformTheme::UiEffects).toInt();
        }

    is_app_running = true; // no longer starting up
}